

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O0

void __thiscall AMinotaur::Tick(AMinotaur *this)

{
  int iVar1;
  uint uVar2;
  TFlags<ActorFlag2,_unsigned_int> local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  uint local_18;
  TFlags<ActorFlag5,_unsigned_int> local_14;
  DWORD flying;
  AMinotaur *this_local;
  
  _flying = this;
  AActor::Tick(&this->super_AActor);
  iVar1 = (int)this;
  TFlags<ActorFlag5,_unsigned_int>::operator&
            (&local_14,
             iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|
                     MF5_NODROPOFF));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
  if (uVar2 == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_1c,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    local_18 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
    local_18 = local_18 << 3;
    TFlags<ActorFlag2,_unsigned_int>::operator&(&local_20,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_20);
    if (uVar2 != local_18) {
      TFlags<ActorFlag2,_unsigned_int>::operator^=(&(this->super_AActor).flags2,MF2_INVULNERABLE);
    }
  }
  return;
}

Assistant:

void AMinotaur::Tick ()
{
	Super::Tick ();
	
	// The unfriendly Minotaur (Heretic's) is invulnerable while charging
	if (!(flags5 & MF5_SUMMONEDMONSTER))
	{
		// Get MF_SKULLFLY bit and shift it so it matches MF2_INVULNERABLE
		DWORD flying = (flags & MF_SKULLFLY) << 3;
		if ((flags2 & MF2_INVULNERABLE) != flying)
		{
			flags2 ^= MF2_INVULNERABLE;
		}
	}
}